

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

string * __thiscall
Server::byteToHex_abi_cxx11_
          (string *__return_storage_ptr__,Server *this,uint8_t *data,uint16_t length)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  undefined6 in_register_0000000a;
  char *pcVar4;
  ulong uVar5;
  undefined8 uStack_20;
  char acStack_18 [8];
  
  iVar2 = (int)CONCAT62(in_register_0000000a,length);
  lVar3 = -(ulong)(iVar2 * 2 + 0xfU & 0xfffffff0);
  pcVar4 = acStack_18 + lVar3;
  if (iVar2 != 0) {
    uVar5 = 0;
    do {
      bVar1 = data[uVar5];
      pcVar4[uVar5 * 2] = "0123456789abcdef"[bVar1 >> 4];
      acStack_18[uVar5 * 2 + lVar3 + 1] = "0123456789abcdef"[bVar1 & 0xf];
      uVar5 = uVar5 + 1;
    } while (length != uVar5);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  *(undefined8 *)((long)&uStack_20 + lVar3) = 0x1080af;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar4,pcVar4 + (uint)(iVar2 * 2));
  return __return_storage_ptr__;
}

Assistant:

string Server::byteToHex(const uint8_t *data, uint16_t length) {
    //If we ever decide to use upper case letters here, make sure to change all tolower transforms to toupper transforms!

    char hexString[length * 2];
    static const char hexChars[16] = {'0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'a', 'b', 'c', 'd', 'e', 'f'};

    for (int j = 0; j < length; j++) {
        hexString[j*2] = hexChars[((data[j] >> 4) & 0xF)];
        hexString[(j*2) + 1] = hexChars[(data[j]) & 0x0F];
    }

    return string(hexString, length * 2);
}